

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkLineDeviceComputer.cxx
# Opt level: O0

string * __thiscall
cmLinkLineDeviceComputer::ComputeLinkLibraries
          (string *__return_storage_ptr__,cmLinkLineDeviceComputer *this,
          cmComputeLinkInformation *cli,string *stdLibString)

{
  cmGeneratorTarget *this_00;
  bool bVar1;
  bool bVar2;
  TargetType TVar3;
  ItemVector *this_01;
  ulong uVar4;
  ostream *poVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  string local_2c0;
  string local_2a0;
  undefined1 local_280 [8];
  string out;
  string local_258;
  byte local_231;
  reference pIStack_230;
  bool skip;
  Item *item;
  const_iterator __end1;
  const_iterator __begin1;
  ItemVector *__range1;
  undefined1 local_208 [7];
  bool skipItemAfterFramework;
  string config;
  ItemVector *items;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  ostringstream fout;
  string *stdLibString_local;
  cmComputeLinkInformation *cli_local;
  cmLinkLineDeviceComputer *this_local;
  
  std::__cxx11::ostringstream::ostringstream
            ((ostringstream *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&items);
  this_01 = cmComputeLinkInformation::GetItems(cli);
  cmComputeLinkInformation::GetConfig_abi_cxx11_((string *)local_208,cli);
  bVar1 = false;
  __end1 = std::
           vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>::
           begin(this_01);
  item = (Item *)std::
                 vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>
                 ::end(this_01);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                                *)&item);
    if (!bVar2) {
      uVar4 = std::__cxx11::string::empty();
      if ((uVar4 & 1) == 0) {
        poVar5 = std::operator<<((ostream *)
                                 &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                 (string *)stdLibString);
        std::operator<<(poVar5," ");
      }
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::~string((string *)local_208);
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&items);
      std::__cxx11::ostringstream::~ostringstream
                ((ostringstream *)&emitted._M_t._M_impl.super__Rb_tree_header._M_node_count);
      return __return_storage_ptr__;
    }
    pIStack_230 = __gnu_cxx::
                  __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
                  ::operator*(&__end1);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      if (pIStack_230->Target != (cmGeneratorTarget *)0x0) {
        local_231 = 0;
        TVar3 = cmGeneratorTarget::GetType(pIStack_230->Target);
        if (TVar3 == STATIC_LIBRARY) {
          this_00 = pIStack_230->Target;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_258,"CUDA_RESOLVE_DEVICE_SYMBOLS",
                     (allocator<char> *)(out.field_2._M_local_buf + 0xf));
          local_231 = cmGeneratorTarget::GetPropertyAsBool(this_00,&local_258);
          std::__cxx11::string::~string((string *)&local_258);
          std::allocator<char>::~allocator((allocator<char> *)(out.field_2._M_local_buf + 0xf));
        }
        else if ((TVar3 == MODULE_LIBRARY) || (TVar3 == INTERFACE_LIBRARY)) {
          local_231 = 1;
        }
        if ((local_231 & 1) != 0) goto LAB_004e1c63;
      }
      std::__cxx11::string::string((string *)local_280);
      if ((pIStack_230->IsPath & 1U) == 0) {
        bVar2 = std::operator==(&pIStack_230->Value,"-framework");
        if (!bVar2) {
          bVar2 = cmLinkItemValidForDevice(&pIStack_230->Value);
          if (bVar2) {
            std::__cxx11::string::operator+=((string *)local_280,(string *)pIStack_230);
          }
          goto LAB_004e1bab;
        }
        bVar1 = true;
      }
      else {
        bVar2 = cmHasLiteralSuffix<std::__cxx11::string,3ul>
                          (&pIStack_230->Value,(char (*) [3])0x7b9dd5);
        if ((bVar2) ||
           (bVar2 = cmHasLiteralSuffix<std::__cxx11::string,5ul>
                              (&pIStack_230->Value,(char (*) [5])".lib"), bVar2)) {
          (*(this->super_cmLinkLineComputer)._vptr_cmLinkLineComputer[2])
                    (&local_2c0,this,pIStack_230);
          cmLinkLineComputer::ConvertToOutputFormat
                    (&local_2a0,&this->super_cmLinkLineComputer,&local_2c0);
          std::__cxx11::string::operator+=((string *)local_280,(string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2a0);
          std::__cxx11::string::~string((string *)&local_2c0);
        }
LAB_004e1bab:
        pVar6 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&items,(value_type *)local_280);
        if (((undefined1  [16])pVar6 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          poVar5 = std::operator<<((ostream *)
                                   &emitted._M_t._M_impl.super__Rb_tree_header._M_node_count,
                                   (string *)local_280);
          std::operator<<(poVar5," ");
        }
      }
      std::__cxx11::string::~string((string *)local_280);
    }
LAB_004e1c63:
    __gnu_cxx::
    __normal_iterator<const_cmComputeLinkInformation::Item_*,_std::vector<cmComputeLinkInformation::Item,_std::allocator<cmComputeLinkInformation::Item>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::string cmLinkLineDeviceComputer::ComputeLinkLibraries(
  cmComputeLinkInformation& cli, std::string const& stdLibString)
{
  // Write the library flags to the build rule.
  std::ostringstream fout;

  // Generate the unique set of link items when device linking.
  // The nvcc device linker is designed so that each static library
  // with device symbols only needs to be listed once as it doesn't
  // care about link order.
  std::set<std::string> emitted;
  typedef cmComputeLinkInformation::ItemVector ItemVector;
  ItemVector const& items = cli.GetItems();
  std::string config = cli.GetConfig();
  bool skipItemAfterFramework = false;
  for (auto const& item : items) {
    if (skipItemAfterFramework) {
      skipItemAfterFramework = false;
      continue;
    }

    if (item.Target) {
      bool skip = false;
      switch (item.Target->GetType()) {
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::INTERFACE_LIBRARY:
          skip = true;
          break;
        case cmStateEnums::STATIC_LIBRARY:
          skip = item.Target->GetPropertyAsBool("CUDA_RESOLVE_DEVICE_SYMBOLS");
          break;
        default:
          break;
      }
      if (skip) {
        continue;
      }
    }

    std::string out;
    if (item.IsPath) {
      // nvcc understands absolute paths to libraries ending in '.a' or '.lib'.
      // These should be passed to nvlink.  Other extensions need to be left
      // out because nvlink may not understand or need them.  Even though it
      // can tolerate '.so' or '.dylib' it cannot tolerate '.so.1'.
      if (cmHasLiteralSuffix(item.Value, ".a") ||
          cmHasLiteralSuffix(item.Value, ".lib")) {
        out += this->ConvertToOutputFormat(
          this->ConvertToLinkReference(item.Value));
      }
    } else if (item.Value == "-framework") {
      // This is the first part of '-framework Name' where the framework
      // name is specified as a following item.  Ignore both.
      skipItemAfterFramework = true;
      continue;
    } else if (cmLinkItemValidForDevice(item.Value)) {
      out += item.Value;
    }

    if (emitted.insert(out).second) {
      fout << out << " ";
    }
  }

  if (!stdLibString.empty()) {
    fout << stdLibString << " ";
  }

  return fout.str();
}